

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.hpp
# Opt level: O0

const_buffer asio::operator+(const_buffer *b,size_t n)

{
  size_t sVar1;
  void *pvVar2;
  size_t local_50;
  size_t new_size;
  char *new_data;
  size_t offset;
  size_t n_local;
  const_buffer *b_local;
  
  sVar1 = const_buffer::size(b);
  local_50 = n;
  if (sVar1 <= n) {
    local_50 = const_buffer::size(b);
  }
  pvVar2 = const_buffer::data(b);
  sVar1 = const_buffer::size(b);
  const_buffer::const_buffer
            ((const_buffer *)&b_local,(void *)((long)pvVar2 + local_50),sVar1 - local_50);
  return _b_local;
}

Assistant:

inline const_buffer operator+(const const_buffer& b,
    std::size_t n) ASIO_NOEXCEPT
{
  std::size_t offset = n < b.size() ? n : b.size();
  const char* new_data = static_cast<const char*>(b.data()) + offset;
  std::size_t new_size = b.size() - offset;
  return const_buffer(new_data, new_size
#if defined(ASIO_ENABLE_BUFFER_DEBUGGING)
      , b.get_debug_check()
#endif // ASIO_ENABLE_BUFFER_DEBUGGING
      );
}